

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode add_next_timeout(timeval now,Curl_multi *multi,Curl_easy *d)

{
  curl_llist *list;
  curl_llist_element *pcVar1;
  __time_t _Var2;
  uint uVar3;
  Curl_tree *in_RAX;
  timeval *ptVar4;
  curl_llist_element *pcVar5;
  
  ptVar4 = &(d->state).expiretime;
  list = (d->state).timeoutlist;
  pcVar5 = list->head;
  if (pcVar5 != (curl_llist_element *)0x0) {
    do {
      pcVar1 = pcVar5->next;
      in_RAX = (Curl_tree *)curlx_tvdiff(*(timeval *)pcVar5->ptr,now);
      if (0 < (long)in_RAX) break;
      uVar3 = Curl_llist_remove(list,pcVar5,(void *)0x0);
      in_RAX = (Curl_tree *)(ulong)uVar3;
      pcVar5 = pcVar1;
    } while (pcVar1 != (curl_llist_element *)0x0);
    pcVar5 = list->head;
    if (pcVar5 != (curl_llist_element *)0x0) {
      _Var2 = *(__time_t *)((long)pcVar5->ptr + 8);
      ptVar4->tv_sec = *pcVar5->ptr;
      (d->state).expiretime.tv_usec = _Var2;
      Curl_llist_remove(list,pcVar5,(void *)0x0);
      in_RAX = Curl_splayinsert((d->state).expiretime,multi->timetree,&(d->state).timenode);
      multi->timetree = in_RAX;
      goto LAB_0012e341;
    }
  }
  ptVar4->tv_sec = 0;
  (d->state).expiretime.tv_usec = 0;
LAB_0012e341:
  return (CURLMcode)in_RAX;
}

Assistant:

static CURLMcode add_next_timeout(struct timeval now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct timeval *tv = &d->state.expiretime;
  struct curl_llist *list = d->state.timeoutlist;
  struct curl_llist_element *e;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct curl_llist_element *n = e->next;
    time_t diff = curlx_tvdiff(*(struct timeval *)e->ptr, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, e->ptr, sizeof(*tv));

    /* remove first entry from list */
    Curl_llist_remove(list, e, NULL);

    /* insert this node again into the splay */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}